

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O0

SRes crnlib::LzmaDecode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte *propData,
                       uint propSize,ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAlloc *alloc)

{
  ulong *in_RCX;
  undefined8 *in_RSI;
  SizeT outSize;
  SizeT inSize;
  int *in_stack_00000010;
  SRes res;
  CLzmaDec p;
  ISzAlloc *alloc_00;
  CLzmaDec *p_00;
  SRes local_c4;
  ISzAlloc *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff4c;
  ELzmaStatus *in_stack_ffffffffffffff60;
  ELzmaFinishMode in_stack_ffffffffffffff6c;
  SizeT *in_stack_ffffffffffffff70;
  ISzAlloc *src_00;
  SizeT in_stack_ffffffffffffff80;
  CLzmaDec *in_stack_ffffffffffffff88;
  SRes local_4;
  
  p_00 = (CLzmaDec *)*in_RCX;
  alloc_00 = (ISzAlloc *)*in_RSI;
  *in_RSI = 0;
  *in_RCX = 0;
  if (p_00 < (CLzmaDec *)0x5) {
    local_4 = 6;
  }
  else {
    local_4 = LzmaDec_AllocateProbs
                        ((CLzmaDec *)0x0,(Byte *)0x0,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff40);
    if (local_4 == 0) {
      src_00 = alloc_00;
      LzmaDec_Init((CLzmaDec *)0x237c11);
      *in_RCX = (ulong)p_00;
      local_c4 = LzmaDec_DecodeToDic(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                     (Byte *)src_00,in_stack_ffffffffffffff70,
                                     in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      if ((local_c4 == 0) && (*in_stack_00000010 == 3)) {
        local_c4 = 6;
      }
      *in_RSI = in_stack_ffffffffffffff70;
      LzmaDec_FreeProbs(p_00,alloc_00);
      local_4 = local_c4;
    }
  }
  return local_4;
}

Assistant:

SRes LzmaDecode(Byte* dest, SizeT* destLen, const Byte* src, SizeT* srcLen,
                const Byte* propData, unsigned propSize, ELzmaFinishMode finishMode,
                ELzmaStatus* status, ISzAlloc* alloc) {
  CLzmaDec p;
  SRes res;
  SizeT inSize = *srcLen;
  SizeT outSize = *destLen;
  *srcLen = *destLen = 0;
  if (inSize < RC_INIT_SIZE)
    return SZ_ERROR_INPUT_EOF;

  LzmaDec_Construct(&p);
  res = LzmaDec_AllocateProbs(&p, propData, propSize, alloc);
  if (res != 0)
    return res;
  p.dic = dest;
  p.dicBufSize = outSize;

  LzmaDec_Init(&p);

  *srcLen = inSize;
  res = LzmaDec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);

  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;

  (*destLen) = p.dicPos;
  LzmaDec_FreeProbs(&p, alloc);
  return res;
}